

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::exceptions::option_has_no_value::option_has_no_value
          (option_has_no_value *this,string *option)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined6 in_stack_ffffffffffffff50;
  byte bVar2;
  byte bVar3;
  allocator<char> local_a8;
  byte local_a7;
  byte local_a6;
  byte local_a5;
  byte local_91;
  allocator<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  uVar1 = std::__cxx11::string::empty();
  local_91 = 0;
  local_a5 = 0;
  local_a6 = 0;
  local_a7 = 0;
  bVar3 = 0;
  bVar2 = 0;
  if ((uVar1 & 1) == 0) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffff70;
    std::operator+((char *)in_stack_ffffffffffffff88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff80);
    local_91 = 1;
    std::operator+(in_RDI,__rhs);
    local_a5 = 1;
    std::operator+(in_RDI,__rhs);
    local_a6 = 1;
    std::operator+(in_RDI,(char *)__rhs);
    local_a7 = 1;
  }
  else {
    std::allocator<char>::allocator();
    bVar3 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    bVar2 = 1;
  }
  exception::exception
            ((exception *)CONCAT17(bVar3,CONCAT16(bVar2,in_stack_ffffffffffffff50)),in_RDI);
  if ((bVar2 & 1) != 0) {
    std::__cxx11::string::~string(local_30);
  }
  if ((bVar3 & 1) != 0) {
    std::allocator<char>::~allocator(&local_a8);
  }
  if ((local_a7 & 1) != 0) {
    std::__cxx11::string::~string(local_30);
  }
  if ((local_a6 & 1) != 0) {
    std::__cxx11::string::~string(local_50);
  }
  if ((local_a5 & 1) != 0) {
    std::__cxx11::string::~string(local_70);
  }
  if ((local_91 & 1) != 0) {
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  }
  *(undefined ***)in_RDI = &PTR__option_has_no_value_004300f8;
  return;
}

Assistant:

explicit option_has_no_value(const std::string& option)
  : exception(
      !option.empty() ?
      ("Option " + LQUOTE + option + RQUOTE + " has no value") :
      "Option has no value")
  {
  }